

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScene::setActiveWindow(QGraphicsScene *this,QGraphicsWidget *widget)

{
  bool bVar1;
  QGraphicsItem *pQVar2;
  QGraphicsItem *z_00;
  QGraphicsItem **ppQVar3;
  double *pdVar4;
  long in_RSI;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  qreal litt;
  QGraphicsItem *sibling;
  QList<QGraphicsItem_*> *__range2;
  QGraphicsItem *parent;
  QGraphicsItem *panel;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QGraphicsItem_*> siblings;
  qreal z;
  QGraphicsItem *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  int line;
  QGraphicsItem *in_stack_ffffffffffffff60;
  QGraphicsScene *in_stack_ffffffffffffff68;
  QGraphicsItem *this_00;
  qreal local_68;
  QGraphicsItem **local_60;
  const_iterator local_58;
  const_iterator local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  double local_30;
  char local_28 [32];
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI == 0) ||
     (pQVar2 = (QGraphicsItem *)QGraphicsItem::scene((QGraphicsItem *)0x9c8db6), pQVar2 == in_RDI))
  {
    if (in_RSI == 0) {
      pQVar2 = (QGraphicsItem *)0x0;
    }
    else {
      pQVar2 = QGraphicsItem::panel(in_RDI);
    }
    this_00 = pQVar2;
    setActivePanel((QGraphicsScene *)pQVar2,in_stack_ffffffffffffff48);
    if (this_00 != (QGraphicsItem *)0x0) {
      z_00 = QGraphicsItem::parentItem((QGraphicsItem *)0x9c8e4b);
      local_30 = QGraphicsItem::zValue((QGraphicsItem *)0x9c8e5a);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      if (z_00 == (QGraphicsItem *)0x0) {
        items(in_stack_ffffffffffffff68,(SortOrder)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      }
      else {
        QGraphicsItem::childItems(in_RDI);
      }
      local_50.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
      local_50 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)pQVar2);
      local_58.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)pQVar2);
      while( true ) {
        local_60 = local_58.i;
        bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_50,local_58);
        if (!bVar1) break;
        ppQVar3 = QList<QGraphicsItem_*>::const_iterator::operator*(&local_50);
        if ((*ppQVar3 != this_00) &&
           (bVar1 = QGraphicsItem::isWindow(in_stack_ffffffffffffff60), bVar1)) {
          local_68 = QGraphicsItem::zValue((QGraphicsItem *)0x9c8f5d);
          pdVar4 = qMax<double>(&local_30,&local_68);
          local_30 = *pdVar4;
        }
        QList<QGraphicsItem_*>::const_iterator::operator++(&local_50);
      }
      QGraphicsItem::setZValue(this_00,(qreal)z_00);
      QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9c8fc6);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffff60,(char *)in_RDI,line,
               (char *)in_stack_ffffffffffffff48);
    QMessageLogger::warning
              (local_28,"QGraphicsScene::setActiveWindow: widget %p must be part of this scene",
               in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::setActiveWindow(QGraphicsWidget *widget)
{
    if (widget && widget->scene() != this) {
        qWarning("QGraphicsScene::setActiveWindow: widget %p must be part of this scene",
                 widget);
        return;
    }

    // Activate the widget's panel (all windows are panels).
    QGraphicsItem *panel = widget ? widget->panel() : nullptr;
    setActivePanel(panel);

    // Raise
    if (panel) {
        QGraphicsItem *parent = panel->parentItem();
        // Raise ### inefficient for toplevels

        // Find the highest z value.
        qreal z = panel->zValue();
        const auto siblings = parent ? parent->childItems() : items();
        for (QGraphicsItem *sibling : siblings) {
            if (sibling != panel && sibling->isWindow())
                z = qMax(z, sibling->zValue());
        }

        // This will probably never overflow.
        const qreal litt = qreal(0.001);
        panel->setZValue(z + litt);
    }
}